

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Apu.cpp
# Opt level: O0

void __thiscall Ay_Apu::reset(Ay_Apu *this)

{
  Ay_Apu *pAVar1;
  Ay_Apu *in_RDI;
  int i;
  osc_t *osc;
  int local_14;
  Ay_Apu *local_10;
  
  in_RDI->last_time = 0;
  (in_RDI->noise).delay = 0;
  (in_RDI->noise).lfsr = 1;
  local_10 = (Ay_Apu *)&in_RDI->last_time;
  do {
    pAVar1 = (Ay_Apu *)(local_10[-1].synth_.impulses + 0x178);
    pAVar1->oscs[0].period = 0x10;
    local_10[-1].synth_.impulses[0x17a] = 0;
    local_10[-1].synth_.impulses[0x17b] = 0;
    local_10[-1].synth_.impulses[0x17c] = 0;
    local_10[-1].synth_.impulses[0x17d] = 0;
    local_10 = pAVar1;
  } while (pAVar1 != in_RDI);
  local_14 = 0x10;
  while (local_14 = local_14 + -1, -1 < local_14) {
    in_RDI->regs[local_14] = '\0';
  }
  in_RDI->regs[7] = 0xff;
  write_data_(in_RDI,0xd,0);
  return;
}

Assistant:

void Ay_Apu::reset()
{
	last_time   = 0;
	noise.delay = 0;
	noise.lfsr  = 1;
	
	osc_t* osc = &oscs [osc_count];
	do
	{
		osc--;
		osc->period   = period_factor;
		osc->delay    = 0;
		osc->last_amp = 0;
		osc->phase    = 0;
	}
	while ( osc != oscs );
	
	for ( int i = sizeof regs; --i >= 0; )
		regs [i] = 0;
	regs [7] = 0xFF;
	write_data_( 13, 0 );
}